

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> * __thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
           *__return_storage_ptr__,PolymorphicMatcher *this)

{
  MonomorphicImpl<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this_00;
  
  this_00 = (MonomorphicImpl<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
            operator_new(0x28);
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::MonomorphicImpl<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::MonomorphicImpl
            (this_00,(HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this);
  Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matcher
            (__return_storage_ptr__,
             (MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
             this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<const T&>(impl_));
  }